

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovQueue.cpp
# Opt level: O0

void __thiscall
cov::Queue::Queue(Queue *this,Context *context,Device *device,bool isOutOfOrder,bool enableProfiling
                 )

{
  bool enableProfiling_local;
  bool isOutOfOrder_local;
  Device *device_local;
  Context *context_local;
  Queue *this_local;
  
  ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>::ClObject
            (&this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>);
  this->m_context = context;
  this->m_device = device;
  this->m_isOutOfOrder = isOutOfOrder;
  this->m_enableProfiling = enableProfiling;
  this->m_vkQueue = context->m_vkQueue;
  (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>).m_initSuccess = true;
  if (((this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>).m_initSuccess & 1U) != 0) {
    ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>::retain
              (&this->m_context->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>);
  }
  return;
}

Assistant:

Queue::Queue(Context& context, Device& device, bool isOutOfOrder, bool enableProfiling)
    : m_context(context),
      m_device(device),
      m_isOutOfOrder(isOutOfOrder),
      m_enableProfiling(enableProfiling),
      m_vkQueue(context.m_vkQueue)
{
    m_initSuccess = true; // fixme
    if (m_initSuccess) m_context.retain();
}